

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::transcode_uastc_to_etc1
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  bool bVar1;
  decoder_etc_block *pdVar2;
  uint8_t *puVar3;
  byte bVar4;
  uint32_t i;
  int iVar5;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 aVar6;
  undefined8 uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  anon_union_4_3_898e29d3_for_color32_0 *block_color;
  bool bVar21;
  uint uVar22;
  color32 block_colors [2];
  color32 block_colors_1 [4];
  anon_union_4_3_898e29d3_for_color32_0 local_78;
  anon_union_4_3_898e29d3_for_color32_0 local_74;
  decoder_etc_block *local_70;
  ulong local_68;
  long local_60;
  int local_58 [4];
  color32 local_48 [4];
  uint8_t *local_38;
  
  if (unpacked_src_blk->m_mode != 8) {
    block_color = &local_78;
    bVar1 = unpacked_src_blk->m_etc1_flip;
    bVar21 = unpacked_src_blk->m_etc1_diff;
    local_68 = (ulong)bVar21;
    *(byte *)((long)pDst + 3) =
         (byte)(unpacked_src_blk->m_etc1_inten1 << 2) |
         (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | bVar1 + bVar21 * '\x02';
    uVar12 = (uint)bVar21 << 4 | 0xf;
    local_60 = (ulong)bVar1 * 0x20 + 0x1e52f1;
    lVar8 = 0;
    bVar1 = true;
    local_70 = (decoder_etc_block *)pDst;
    do {
      bVar21 = bVar1;
      lVar15 = lVar8 * 0x10 + local_60;
      lVar18 = 0;
      iVar5 = 0;
      iVar10 = 0;
      iVar14 = 0;
      do {
        bVar4 = *(byte *)(lVar15 + lVar18 * 2);
        bVar9 = *(byte *)(lVar15 + -1 + lVar18 * 2);
        iVar14 = iVar14 + (uint)block_pixels[bVar4][bVar9].field_0.field_0.r;
        iVar10 = iVar10 + (uint)block_pixels[bVar4][bVar9].field_0.field_0.g;
        iVar5 = iVar5 + (uint)block_pixels[bVar4][bVar9].field_0.field_0.b;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 8);
      (block_color->field_0).r = (uint8_t)((iVar14 * uVar12 + 0x3fc) / 0x7f8);
      (block_color->field_0).g = (uint8_t)((iVar10 * uVar12 + 0x3fc) / 0x7f8);
      (block_color->field_0).b = (uint8_t)((iVar5 * uVar12 + 0x3fc) / 0x7f8);
      (block_color->field_0).a = '\0';
      uVar16 = (ulong)unpacked_src_blk->m_mode;
      if ((0x1d00UL >> (uVar16 & 0x3f) & 1) == 0) {
        aVar6 = (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                apply_etc1_bias((color32 *)&block_color->field_0,unpacked_src_blk->m_etc1_bias,
                                uVar12,(uint32_t)lVar8);
        uVar16 = (ulong)(uint)aVar6;
        block_color->field_0 = aVar6;
      }
      lVar8 = 1;
      block_color = &local_74;
      bVar1 = false;
    } while (bVar21);
    if ((char)local_68 == '\0') {
      uVar16 = CONCAT71((int7)(uVar16 >> 8),local_78.field_0.r << 4 | local_74.field_0.r);
      bVar4 = local_78.field_0.g << 4 | local_74.field_0.g;
      bVar9 = local_78.field_0.b << 4 | local_74.field_0.b;
    }
    else {
      iVar10 = (uint)local_74.field_0.r - (uint)local_78.field_0.r;
      iVar17 = (uint)local_74.field_0.g - (uint)local_78.field_0.g;
      iVar14 = (uint)local_74.field_0.b - (uint)local_78.field_0.b;
      iVar5 = 3;
      if (iVar10 < 3) {
        iVar5 = iVar10;
      }
      if (iVar5 < -3) {
        iVar5 = -4;
      }
      iVar11 = 3;
      if (iVar17 < 3) {
        iVar11 = iVar17;
      }
      if (iVar11 < -3) {
        iVar11 = -4;
      }
      iVar19 = 3;
      if (iVar14 < 3) {
        iVar19 = iVar14;
      }
      if (iVar19 < -3) {
        iVar19 = -4;
      }
      uVar16 = (ulong)((uint)local_78.field_0.r << 3 | iVar5 + (iVar10 >> 0x1f) * -8);
      bVar4 = local_78.field_0.g << 3 | (char)iVar11 + (char)(iVar17 >> 0x1f) * -8;
      bVar9 = local_78.field_0.b << 3 | (char)iVar19 + (char)(iVar14 >> 0x1f) * -8;
    }
    (local_70->field_0).m_bytes[0] = (uint8_t)uVar16;
    (local_70->field_0).m_bytes[1] = bVar4;
    (local_70->field_0).m_bytes[2] = bVar9;
    local_38 = &(*block_pixels)[0].field_0.field_0.b;
    uVar7 = CONCAT71((int7)(uVar16 >> 8),1);
    lVar8 = 0;
    uVar22 = 0;
    uVar12 = 0;
    do {
      puVar3 = local_38;
      pdVar2 = local_70;
      local_68 = CONCAT44(local_68._4_4_,(int)uVar7);
      decoder_etc_block::get_block_colors(local_70,local_48,(uint32_t)lVar8);
      lVar15 = 0;
      do {
        local_58[lVar15] =
             (uint)local_48[lVar15].field_0.field_0.b * 0x13 +
             (uint)local_48[lVar15].field_0.field_0.g * 0xb7 +
             (uint)local_48[lVar15].field_0.field_0.r * 0x36;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      if (((pdVar2->field_0).m_bytes[3] & 1) == 0) {
        iVar5 = (uint32_t)lVar8 * 8;
        lVar15 = 0;
        bVar1 = true;
        do {
          bVar21 = bVar1;
          lVar15 = lVar15 * 4 + lVar8 * 8;
          lVar18 = 0;
          iVar10 = iVar5;
          do {
            uVar13 = (uint)puVar3[lVar18 + lVar15] * 0x26 +
                     (uint)puVar3[lVar18 + lVar15 + -1] * 0x16e +
                     (uint)puVar3[lVar18 + lVar15 + -2] * 0x6c;
            uVar22 = uVar22 | ("\x01"[(ulong)(uVar13 < (uint)(local_58[1] + local_58[2])) +
                                      (ulong)(uVar13 < (uint)(local_58[0] + local_58[1])) +
                                      (ulong)(uVar13 < (uint)(local_58[2] + local_58[3]))] & 1) <<
                              ((byte)iVar10 & 0x1f);
            uVar12 = uVar12 | (uint)("\x01"[(ulong)(uVar13 < (uint)(local_58[1] + local_58[2])) +
                                            (ulong)(uVar13 < (uint)(local_58[0] + local_58[1])) +
                                            (ulong)(uVar13 < (uint)(local_58[2] + local_58[3]))] >>
                                    1) << ((byte)iVar10 & 0x1f);
            iVar10 = iVar10 + 1;
            lVar18 = lVar18 + 0x10;
          } while (lVar18 != 0x40);
          iVar5 = iVar5 + 4;
          lVar15 = 1;
          bVar1 = false;
        } while (bVar21);
      }
      else {
        uVar16 = lVar8 * 2;
        iVar5 = (int)uVar16 + 1;
        local_60 = CONCAT44(local_60._4_4_,iVar5);
        lVar15 = 0;
        uVar20 = uVar16;
        do {
          lVar15 = lVar15 * 0x10 + lVar8 * 0x20;
          lVar18 = 0;
          do {
            bVar4 = (char)uVar16 + (char)lVar18;
            uVar13 = (uint)puVar3[lVar18 + lVar15] * 0x26 +
                     (uint)puVar3[lVar18 + lVar15 + -1] * 0x16e +
                     (uint)puVar3[lVar18 + lVar15 + -2] * 0x6c;
            uVar22 = uVar22 | ("\x01"[(ulong)(uVar13 < (uint)(local_58[1] + local_58[2])) +
                                      (ulong)(uVar13 < (uint)(local_58[0] + local_58[1])) +
                                      (ulong)(uVar13 < (uint)(local_58[2] + local_58[3]))] & 1) <<
                              (bVar4 & 0x1f);
            uVar12 = uVar12 | (uint)("\x01"[(ulong)(uVar13 < (uint)(local_58[1] + local_58[2])) +
                                            (ulong)(uVar13 < (uint)(local_58[0] + local_58[1])) +
                                            (ulong)(uVar13 < (uint)(local_58[2] + local_58[3]))] >>
                                    1) << (bVar4 & 0x1f);
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          iVar10 = (int)uVar20;
          uVar16 = uVar16 + 1;
          lVar15 = 1;
          uVar20 = (ulong)(iVar10 + 1);
        } while (iVar10 != iVar5);
      }
      lVar8 = 1;
      uVar7 = 0;
    } while ((local_68 & 1) != 0);
    *(ushort *)((long)&local_70->field_0 + 6) = (ushort)uVar22 << 8 | (ushort)uVar22 >> 8;
    (local_70->field_0).m_bytes[5] = (uint8_t)uVar12;
    (local_70->field_0).m_bytes[4] = (uint8_t)(uVar12 >> 8);
    return;
  }
  *(byte *)((long)pDst + 3) =
       (byte)(unpacked_src_blk->m_etc1_inten0 << 2) |
       (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | unpacked_src_blk->m_etc1_diff * '\x02';
  bVar4 = (byte)unpacked_src_blk->m_etc1_r;
  if (unpacked_src_blk->m_etc1_diff == true) {
    *(byte *)pDst = bVar4 << 3;
    *(char *)((long)pDst + 1) = (char)unpacked_src_blk->m_etc1_g << 3;
    bVar4 = (char)unpacked_src_blk->m_etc1_b << 3;
  }
  else {
    *(byte *)pDst = (byte)(unpacked_src_blk->m_etc1_r << 4) | bVar4;
    *(byte *)((long)pDst + 1) =
         (byte)(unpacked_src_blk->m_etc1_g << 4) | (byte)unpacked_src_blk->m_etc1_g;
    bVar4 = (byte)(unpacked_src_blk->m_etc1_b << 4) | (byte)unpacked_src_blk->m_etc1_b;
  }
  *(byte *)((long)pDst + 2) = bVar4;
  *(undefined4 *)((long)pDst + 4) =
       *(undefined4 *)(s_etc1_solid_selectors + (ulong)unpacked_src_blk->m_etc1_selector * 4);
  return;
}

Assistant:

void transcode_uastc_to_etc1(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		decoder_etc_block& dst_blk = *static_cast<decoder_etc_block*>(pDst);

		if (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			dst_blk.m_bytes[3] = (uint8_t)((unpacked_src_blk.m_etc1_diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten0 << 2));

			if (unpacked_src_blk.m_etc1_diff)
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r << 3);
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g << 3);
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b << 3);
			}
			else
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r | (unpacked_src_blk.m_etc1_r << 4));
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g | (unpacked_src_blk.m_etc1_g << 4));
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b | (unpacked_src_blk.m_etc1_b << 4));
			}

			memcpy(dst_blk.m_bytes + 4, &s_etc1_solid_selectors[unpacked_src_blk.m_etc1_selector][0], 4);

			return;
		}

		const bool flip = unpacked_src_blk.m_etc1_flip != 0;
		const bool diff = unpacked_src_blk.m_etc1_diff != 0;

		dst_blk.m_bytes[3] = (uint8_t)((int)flip | (diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten1 << 2));

		const uint32_t limit = diff ? 31 : 15;

		color32 block_colors[2];

		for (uint32_t subset = 0; subset < 2; subset++)
		{
			uint32_t avg_color[3];
			memset(avg_color, 0, sizeof(avg_color));

			for (uint32_t j = 0; j < 8; j++)
			{
				const etc_coord2& c = g_etc1_pixel_coords[flip][subset][j];

				avg_color[0] += block_pixels[c.m_y][c.m_x].r;
				avg_color[1] += block_pixels[c.m_y][c.m_x].g;
				avg_color[2] += block_pixels[c.m_y][c.m_x].b;
			} // j

			block_colors[subset][0] = (uint8_t)((avg_color[0] * limit + 1020) / (8 * 255));
			block_colors[subset][1] = (uint8_t)((avg_color[1] * limit + 1020) / (8 * 255));
			block_colors[subset][2] = (uint8_t)((avg_color[2] * limit + 1020) / (8 * 255));
			block_colors[subset][3] = 0;

			if (g_uastc_mode_has_etc1_bias[unpacked_src_blk.m_mode])
			{
				block_colors[subset] = apply_etc1_bias(block_colors[subset], unpacked_src_blk.m_etc1_bias, limit, subset);
			}

		} // subset

		if (diff)
		{
			int dr = block_colors[1].r - block_colors[0].r;
			int dg = block_colors[1].g - block_colors[0].g;
			int db = block_colors[1].b - block_colors[0].b;

			dr = basisu::clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = basisu::clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = basisu::clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);

			if (dr < 0) dr += 8;
			if (dg < 0) dg += 8;
			if (db < 0) db += 8;

			dst_blk.m_bytes[0] = (uint8_t)((block_colors[0].r << 3) | dr);
			dst_blk.m_bytes[1] = (uint8_t)((block_colors[0].g << 3) | dg);
			dst_blk.m_bytes[2] = (uint8_t)((block_colors[0].b << 3) | db);
		}
		else
		{
			dst_blk.m_bytes[0] = (uint8_t)(block_colors[1].r | (block_colors[0].r << 4));
			dst_blk.m_bytes[1] = (uint8_t)(block_colors[1].g | (block_colors[0].g << 4));
			dst_blk.m_bytes[2] = (uint8_t)(block_colors[1].b | (block_colors[0].b << 4));
		}

		etc1_determine_selectors(dst_blk, &block_pixels[0][0], 0, 2);
	}